

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O2

parser_error parse_prefs_object(parser *p)

{
  flavor *pfVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  char *pcVar5;
  char *name;
  object_kind *poVar6;
  flavor **ppfVar7;
  long lVar8;
  ulong uVar9;
  angband_constants *paVar10;
  
  pcVar5 = (char *)parser_priv(p);
  if (pcVar5 == (char *)0x0) {
    __assert_fail("d != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-prefs.c"
                  ,0x260,"enum parser_error parse_prefs_object(struct parser *)");
  }
  if (*pcVar5 != '\0') {
    return PARSE_ERROR_NONE;
  }
  pcVar5 = parser_getsym(p,"tval");
  name = parser_getsym(p,"sval");
  if ((*pcVar5 == '*') && (pcVar5[1] == '\0')) {
    wVar2 = parser_getint(p,"attr");
    wVar3 = parser_getint(p,"char");
    if (*name != '*') {
      return PARSE_ERROR_UNRECOGNISED_SVAL;
    }
    if (name[1] != '\0') {
      return PARSE_ERROR_UNRECOGNISED_SVAL;
    }
    lVar8 = 0x20;
    for (uVar9 = 0; poVar6 = k_info, uVar9 < z_info->k_max; uVar9 = uVar9 + 1) {
      kind_x_attr[*(uint *)(k_info->flags + lVar8 + -0x80)] = (uint8_t)wVar2;
      kind_x_char[*(uint *)(poVar6->flags + lVar8 + -0x80)] = wVar3;
      lVar8 = lVar8 + 0x2c0;
    }
    ppfVar7 = &flavors;
    while (pfVar1 = *ppfVar7, pfVar1 != (flavor *)0x0) {
      flavor_x_attr[pfVar1->fidx] = (uint8_t)wVar2;
      flavor_x_char[pfVar1->fidx] = wVar3;
      ppfVar7 = &pfVar1->next;
    }
  }
  else {
    wVar2 = tval_find_idx(pcVar5);
    if (wVar2 < L'\0') {
      return PARSE_ERROR_UNRECOGNISED_TVAL;
    }
    if ((*name != '*') || (name[1] != '\0')) {
      wVar3 = lookup_sval(wVar2,name);
      if (wVar3 < L'\0') {
        return PARSE_ERROR_NONE;
      }
      poVar6 = lookup_kind(wVar2,wVar3);
      if (poVar6 == (object_kind *)0x0) {
        return PARSE_ERROR_NONE;
      }
      wVar2 = parser_getint(p,"attr");
      kind_x_attr[poVar6->kidx] = (uint8_t)wVar2;
      wVar2 = parser_getint(p,"char");
      kind_x_char[poVar6->kidx] = wVar2;
      return PARSE_ERROR_NONE;
    }
    wVar3 = parser_getint(p,"attr");
    wVar4 = parser_getint(p,"char");
    lVar8 = 0x20;
    paVar10 = z_info;
    for (uVar9 = 0; poVar6 = k_info, uVar9 < paVar10->k_max; uVar9 = uVar9 + 1) {
      if (*(wchar_t *)(k_info->flags + lVar8 + -0x7c) == wVar2) {
        kind_x_attr[*(uint *)(k_info->flags + lVar8 + -0x80)] = (uint8_t)wVar3;
        kind_x_char[*(uint *)(poVar6->flags + lVar8 + -0x80)] = wVar4;
        paVar10 = z_info;
      }
      lVar8 = lVar8 + 0x2c0;
    }
    ppfVar7 = &flavors;
    while (pfVar1 = *ppfVar7, pfVar1 != (flavor *)0x0) {
      if (wVar2 == (uint)pfVar1->tval) {
        flavor_x_attr[pfVar1->fidx] = (uint8_t)wVar3;
        flavor_x_char[pfVar1->fidx] = wVar4;
      }
      ppfVar7 = &pfVar1->next;
    }
  }
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_prefs_object(struct parser *p)
{
	int tvi, svi;
	struct object_kind *kind;
	const char *tval, *sval;

	struct prefs_data *d = parser_priv(p);
	assert(d != NULL);
	if (d->bypass) return PARSE_ERROR_NONE;

	tval = parser_getsym(p, "tval");
	sval = parser_getsym(p, "sval");
	if (streq(tval, "*")) {
		/* object:*:* means handle all objects and flavors */
		uint8_t attr = parser_getint(p, "attr");
		wchar_t chr = parser_getint(p, "char");
		size_t i;
		struct flavor *flavor;

		if (!streq(sval, "*"))
			return PARSE_ERROR_UNRECOGNISED_SVAL;

		for (i = 0; i < z_info->k_max; i++) {
			struct object_kind *kind_local = &k_info[i];

			kind_x_attr[kind_local->kidx] = attr;
			kind_x_char[kind_local->kidx] = chr;
		}

		for (flavor = flavors; flavor; flavor = flavor->next) {
			flavor_x_attr[flavor->fidx] = attr;
			flavor_x_char[flavor->fidx] = chr;
		}
	} else {
		tvi = tval_find_idx(tval);
		if (tvi < 0)
			return PARSE_ERROR_UNRECOGNISED_TVAL;

		/* object:tval:* means handle all objects and flavors with this tval */
		if (streq(sval, "*")) {
			uint8_t attr = parser_getint(p, "attr");
			wchar_t chr = parser_getint(p, "char");
			size_t i;
			struct flavor *flavor;

			for (i = 0; i < z_info->k_max; i++) {
				struct object_kind *kind_local = &k_info[i];

				if (kind_local->tval != tvi)
					continue;

				kind_x_attr[kind_local->kidx] = attr;
				kind_x_char[kind_local->kidx] = chr;
			}

			for (flavor = flavors; flavor; flavor = flavor->next)
				if (flavor->tval == tvi) {
					flavor_x_attr[flavor->fidx] = attr;
					flavor_x_char[flavor->fidx] = chr;
				}

		} else {
			/* No error at incorrect sval to stop failure due to outdated
			 * pref files and enable switching between old and new classes */
			svi = lookup_sval(tvi, sval);
			if (svi < 0)
				return PARSE_ERROR_NONE;

			kind = lookup_kind(tvi, svi);
			if (!kind)
				return PARSE_ERROR_NONE;

			kind_x_attr[kind->kidx] = (uint8_t)parser_getint(p, "attr");
			kind_x_char[kind->kidx] = (wchar_t)parser_getint(p, "char");
		}
	}

	return PARSE_ERROR_NONE;
}